

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

void __thiscall LibGens::Ym2612::update(Ym2612 *this,int32_t *bufL,int32_t *bufR,int length)

{
  int iVar1;
  uint uVar2;
  int local_2c;
  int j;
  int i;
  int algo_type;
  int length_local;
  int32_t *bufR_local;
  int32_t *bufL_local;
  Ym2612 *this_local;
  
  if ((this->d->state).CHANNEL[0]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(this->d,(this->d->state).CHANNEL);
  }
  if ((this->d->state).CHANNEL[1]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(this->d,(this->d->state).CHANNEL + 1);
  }
  if ((this->d->state).CHANNEL[2]._SLOT[0].Finc == -1) {
    if (((this->d->state).Mode & 0x40U) == 0) {
      Ym2612Private::CALC_FINC_CH(this->d,(this->d->state).CHANNEL + 2);
    }
    else {
      Ym2612Private::CALC_FINC_SL
                ((this->d->state).CHANNEL[2]._SLOT,
                 this->d->FINC_TAB[(this->d->state).CHANNEL[2].FNUM[2]] >>
                 (7U - (char)(this->d->state).CHANNEL[2].FOCT[2] & 0x1f),
                 (this->d->state).CHANNEL[2].KC[2]);
      Ym2612Private::CALC_FINC_SL
                ((this->d->state).CHANNEL[2]._SLOT + 2,
                 this->d->FINC_TAB[(this->d->state).CHANNEL[2].FNUM[3]] >>
                 (7U - (char)(this->d->state).CHANNEL[2].FOCT[3] & 0x1f),
                 (this->d->state).CHANNEL[2].KC[3]);
      Ym2612Private::CALC_FINC_SL
                ((this->d->state).CHANNEL[2]._SLOT + 1,
                 this->d->FINC_TAB[(this->d->state).CHANNEL[2].FNUM[1]] >>
                 (7U - (char)(this->d->state).CHANNEL[2].FOCT[1] & 0x1f),
                 (this->d->state).CHANNEL[2].KC[1]);
      Ym2612Private::CALC_FINC_SL
                ((this->d->state).CHANNEL[2]._SLOT + 3,
                 this->d->FINC_TAB[(this->d->state).CHANNEL[2].FNUM[0]] >>
                 (7U - (char)(this->d->state).CHANNEL[2].FOCT[0] & 0x1f),
                 (this->d->state).CHANNEL[2].KC[0]);
    }
  }
  if ((this->d->state).CHANNEL[3]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(this->d,(this->d->state).CHANNEL + 3);
  }
  if ((this->d->state).CHANNEL[4]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(this->d,(this->d->state).CHANNEL + 4);
  }
  if ((this->d->state).CHANNEL[5]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(this->d,(this->d->state).CHANNEL + 5);
  }
  if (((this->d->state).Inter_Step & 0x4000) == 0) {
    j = 0x10;
  }
  else {
    j = 0;
  }
  if ((this->d->state).LFOinc != 0) {
    for (local_2c = 0; local_2c < length; local_2c = local_2c + 1) {
      iVar1 = (this->d->state).LFOinc + (this->d->state).LFOcnt;
      (this->d->state).LFOcnt = iVar1;
      uVar2 = iVar1 >> 0x12 & 0x3ff;
      this->d->LFO_ENV_UP[local_2c] = *(int *)(Ym2612Private::LFO_ENV_TAB + (long)(int)uVar2 * 4);
      this->d->LFO_FREQ_UP[local_2c] = *(int *)(Ym2612Private::LFO_FREQ_TAB + (long)(int)uVar2 * 4);
    }
    j = j | 8;
  }
  Ym2612Private::Update_Chan
            (this->d,(this->d->state).CHANNEL[0].ALGO + j,(this->d->state).CHANNEL,bufL,bufR,length)
  ;
  Ym2612Private::Update_Chan
            (this->d,(this->d->state).CHANNEL[1].ALGO + j,(this->d->state).CHANNEL + 1,bufL,bufR,
             length);
  Ym2612Private::Update_Chan
            (this->d,(this->d->state).CHANNEL[2].ALGO + j,(this->d->state).CHANNEL + 2,bufL,bufR,
             length);
  Ym2612Private::Update_Chan
            (this->d,(this->d->state).CHANNEL[3].ALGO + j,(this->d->state).CHANNEL + 3,bufL,bufR,
             length);
  Ym2612Private::Update_Chan
            (this->d,(this->d->state).CHANNEL[4].ALGO + j,(this->d->state).CHANNEL + 4,bufL,bufR,
             length);
  if ((this->d->state).DAC == 0) {
    Ym2612Private::Update_Chan
              (this->d,(this->d->state).CHANNEL[5].ALGO + j,(this->d->state).CHANNEL + 5,bufL,bufR,
               length);
  }
  (this->d->state).Inter_Cnt = this->d->int_cnt;
  return;
}

Assistant:

void Ym2612::update(int32_t *bufL, int32_t *bufR, int length)
{
//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG4,
//		"Starting generating sound...");

	// Mise à jour des pas des compteurs-fréquences s'ils ont été modifiés
 	if (d->state.CHANNEL[0]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[0]);
	}
	if (d->state.CHANNEL[1]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[1]);
	}
	if (d->state.CHANNEL[2]._SLOT[0].Finc == -1) {
		if (d->state.Mode & 0x40) {
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S0]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[2]] >> (7 - d->state.CHANNEL[2].FOCT[2]),
				d->state.CHANNEL[2].KC[2]);
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S1]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[3]] >> (7 - d->state.CHANNEL[2].FOCT[3]),
				d->state.CHANNEL[2].KC[3]);
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S2]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[1]] >> (7 - d->state.CHANNEL[2].FOCT[1]),
				d->state.CHANNEL[2].KC[1]);
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S3]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[0]] >> (7 - d->state.CHANNEL[2].FOCT[0]),
				d->state.CHANNEL[2].KC[0]);
		} else {
			d->CALC_FINC_CH(&d->state.CHANNEL[2]);
		}
	}
	if (d->state.CHANNEL[3]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[3]);
	}
	if (d->state.CHANNEL[4]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[4]);
	}
	if (d->state.CHANNEL[5]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[5]);
	}

	/*
	d->CALC_FINC_CH(&d->state.CHANNEL[0]);
	d->CALC_FINC_CH(&d->state.CHANNEL[1]);
	if (d->state.Mode & 0x40) {
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[0]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[2]] >> (7 - d->state.CHANNEL[2].FOCT[2]), YM2612.CHANNEL[2].KC[2]);
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[1]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[3]] >> (7 - d->state.CHANNEL[2].FOCT[3]), YM2612.CHANNEL[2].KC[3]);
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[2]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[1]] >> (7 - d->state.CHANNEL[2].FOCT[1]), YM2612.CHANNEL[2].KC[1]);
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[3]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[0]] >> (7 - d->state.CHANNEL[2].FOCT[0]), d->state.CHANNEL[2].KC[0]);
	} else {
		d->CALC_FINC_CH(&d->state.CHANNEL[2]);
	}
	d->CALC_FINC_CH(&d->state.CHANNEL[3]);
	d->CALC_FINC_CH(&d->state.CHANNEL[4]);
	d->CALC_FINC_CH(&d->state.CHANNEL[5]);
	*/

	// Determine the algorithm type.
	int algo_type;
	if (d->state.Inter_Step & 0x04000) {
		algo_type = 0;
	} else {
		algo_type = 16;
	}

	if (d->state.LFOinc) {
		// Precalculate LFO wav

		for (int i = 0; i < length; i++) {
			int j = ((d->state.LFOcnt += d->state.LFOinc) >> LFO_LBITS) & d->LFO_MASK;

			d->LFO_ENV_UP[i] = d->LFO_ENV_TAB[j];
			d->LFO_FREQ_UP[i] = d->LFO_FREQ_TAB[j];

//			LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG4,
//				"LFO_ENV_UP[%d] = %d   LFO_FREQ_UP[%d] = %d",
//				i, d->LFO_ENV_UP[i], i, d->LFO_FREQ_UP[i]);
		}

		algo_type |= 8;
	}

	d->Update_Chan((d->state.CHANNEL[0].ALGO + algo_type), &(d->state.CHANNEL[0]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[1].ALGO + algo_type), &(d->state.CHANNEL[1]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[2].ALGO + algo_type), &(d->state.CHANNEL[2]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[3].ALGO + algo_type), &(d->state.CHANNEL[3]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[4].ALGO + algo_type), &(d->state.CHANNEL[4]), bufL, bufR, length);
	if (!(d->state.DAC)) {
		// Update channel 6 only if DAC is disabled.
		d->Update_Chan((d->state.CHANNEL[5].ALGO + algo_type), &(d->state.CHANNEL[5]), bufL, bufR, length);
	}

	d->state.Inter_Cnt = d->int_cnt;

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG4,
//		"Finishing generating sound...");
}